

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

double SoapySDRDevice_getMasterClockRate(SoapySDRDevice *device)

{
  long *in_RDI;
  double dVar1;
  exception *ex;
  
  SoapySDRDevice_clearError();
  dVar1 = (double)(**(code **)(*in_RDI + 0x240))();
  return dVar1;
}

Assistant:

double SoapySDRDevice_getMasterClockRate(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getMasterClockRate();
    __SOAPY_SDR_C_CATCH_RET(NAN);
}